

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O1

void __thiscall Minisat::SimpSolver::gatherTouchedClauses(SimpSolver *this)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint in_EAX;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  vec<unsigned_int,_int> *pvVar11;
  int i;
  undefined8 uStack_38;
  int iVar10;
  
  if (this->n_touched != 0) {
    uStack_38._4_4_ = 0;
    iVar9 = (this->subsumption_queue).end;
    iVar8 = (this->subsumption_queue).buf.sz;
    iVar4 = (this->subsumption_queue).first;
    iVar5 = iVar9 - iVar4;
    iVar10 = 0;
    if (iVar9 < iVar4) {
      iVar10 = iVar8;
    }
    iVar9 = iVar10 + iVar5;
    if (iVar9 != 0 && SCARRY4(iVar10,iVar5) == iVar9 < 0) {
      do {
        puVar3 = (this->super_Solver).ca.ra.memory;
        uVar1 = (this->subsumption_queue).buf.data[(iVar4 + uStack_38._4_4_) % iVar8];
        uVar2 = puVar3[uVar1];
        if ((uVar2 & 3) == 0) {
          puVar3[uVar1] = uVar2 | 2;
        }
        uStack_38._4_4_ = uStack_38._4_4_ + 1;
        iVar9 = (this->subsumption_queue).end;
        iVar8 = (this->subsumption_queue).buf.sz;
        iVar4 = (this->subsumption_queue).first;
        iVar10 = 0;
        if (iVar9 < iVar4) {
          iVar10 = iVar8;
        }
      } while (uStack_38._4_4_ < (iVar9 - iVar4) + iVar10);
    }
    uStack_38 = (ulong)in_EAX;
    if (0 < (this->super_Solver).next_var) {
      iVar9 = 0;
      do {
        if ((this->touched).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[iVar9]
            != '\0') {
          if ((this->occurs).dirty.map.data[iVar9] != '\0') {
            OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
            ::clean(&this->occurs,(int *)((long)&uStack_38 + 4));
          }
          pvVar11 = (this->occurs).occs.map.data;
          if (0 < pvVar11[uStack_38._4_4_].sz) {
            pvVar11 = pvVar11 + uStack_38._4_4_;
            lVar7 = 0;
            do {
              if (((this->super_Solver).ca.ra.memory[pvVar11->data[lVar7]] & 3) == 0) {
                Queue<unsigned_int>::insert(&this->subsumption_queue,pvVar11->data[lVar7]);
                puVar3 = (this->super_Solver).ca.ra.memory;
                puVar3[pvVar11->data[lVar7]] = puVar3[pvVar11->data[lVar7]] & 0xfffffffc | 2;
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 < pvVar11->sz);
          }
          (this->touched).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data
          [uStack_38._4_4_] = '\0';
        }
        iVar9 = uStack_38._4_4_ + 1;
        uStack_38 = CONCAT44(iVar9,(undefined4)uStack_38);
      } while (iVar9 < (this->super_Solver).next_var);
    }
    iVar5 = 0;
    iVar9 = (this->subsumption_queue).end;
    iVar8 = (this->subsumption_queue).buf.sz;
    iVar4 = (this->subsumption_queue).first;
    iVar6 = iVar9 - iVar4;
    iVar10 = 0;
    if (iVar9 < iVar4) {
      iVar10 = iVar8;
    }
    iVar9 = iVar10 + iVar6;
    if (iVar9 != 0 && SCARRY4(iVar10,iVar6) == iVar9 < 0) {
      do {
        puVar3 = (this->super_Solver).ca.ra.memory;
        uVar1 = (this->subsumption_queue).buf.data[(iVar4 + iVar5) % iVar8];
        uVar2 = puVar3[uVar1];
        if ((uVar2 & 3) == 2) {
          puVar3[uVar1] = uVar2 & 0xfffffffc;
        }
        iVar5 = iVar5 + 1;
        iVar9 = (this->subsumption_queue).end;
        iVar8 = (this->subsumption_queue).buf.sz;
        iVar4 = (this->subsumption_queue).first;
        iVar10 = 0;
        if (iVar9 < iVar4) {
          iVar10 = iVar8;
        }
      } while (iVar5 < (iVar9 - iVar4) + iVar10);
    }
    this->n_touched = 0;
  }
  return;
}

Assistant:

void SimpSolver::gatherTouchedClauses()
{
    if (n_touched == 0) return;

    int i,j;
    for (i = 0; i < subsumption_queue.size(); i++)
        if (ca[subsumption_queue[i]].mark() == 0)
            ca[subsumption_queue[i]].mark(2);

    for (i = 0; i < nVars(); i++)
        if (touched[i]){
            const vec<CRef>& cs = occurs.lookup(i);
            for (j = 0; j < cs.size(); j++)
                if (ca[cs[j]].mark() == 0){
                    subsumption_queue.insert(cs[j]);
                    ca[cs[j]].mark(2);
                }
            touched[i] = 0;
        }

    for (i = 0; i < subsumption_queue.size(); i++)
        if (ca[subsumption_queue[i]].mark() == 2)
            ca[subsumption_queue[i]].mark(0);

    n_touched = 0;
}